

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshalgo.c
# Opt level: O3

void psh_glyph_interpolate_normal_points(PSH_Glyph glyph,FT_Int dimension)

{
  PSH_Point_conflict pPVar1;
  FT_Memory memory;
  FT_Fixed FVar2;
  PSH_Point *ppPVar3;
  uint uVar4;
  ulong *P;
  PSH_Point_conflict pPVar5;
  FT_Long FVar6;
  ulong *puVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  long a_;
  PSH_Point_conflict pPVar13;
  uint uVar14;
  ulong uVar15;
  ulong local_e8;
  PSH_Point_conflict strongs_0 [16];
  int local_34 [2];
  FT_Error error;
  
  uVar14 = glyph->num_points;
  if ((ulong)uVar14 != 0) {
    memory = glyph->memory;
    FVar2 = glyph->globals->dimension[(uint)dimension].scale_mult;
    pPVar13 = glyph->points;
    pPVar1 = pPVar13 + uVar14;
    uVar4 = 0;
    pPVar5 = pPVar13;
    do {
      uVar4 = uVar4 + ((pPVar5->flags2 >> 4 & 1) != 0);
      pPVar5 = pPVar5 + 1;
    } while (pPVar5 < pPVar1);
    if (uVar4 != 0) {
      if (uVar4 < 0x11) {
        P = &local_e8;
      }
      else {
        P = (ulong *)ft_mem_realloc(memory,8,0,(ulong)uVar4,(void *)0x0,local_34);
        if (local_34[0] != 0) {
          return;
        }
      }
      if (uVar14 != 0) {
        uVar15 = 0;
        pPVar5 = pPVar13;
        do {
          if ((pPVar5->flags2 & 0x10) != 0) {
            puVar7 = P + uVar15;
            if ((int)uVar15 != 0) {
              lVar10 = pPVar5->org_u;
              do {
                if (*(long *)(puVar7[-1] + 0x30) <= lVar10) break;
                *puVar7 = puVar7[-1];
                puVar7 = puVar7 + -1;
              } while (P < puVar7);
            }
            *puVar7 = (ulong)pPVar5;
            uVar15 = (ulong)((int)uVar15 + 1);
          }
          pPVar5 = pPVar5 + 1;
        } while (pPVar5 < pPVar1);
        if (uVar14 != 0) {
          uVar14 = (uint)uVar15;
          strongs_0[0xf] = (PSH_Point_conflict)(P + (uVar15 - 1));
          do {
            uVar4 = pPVar13->flags2;
            if ((uVar4 & 0x10) == 0) {
              uVar9 = pPVar13->flags;
              if ((uVar9 & 2) != 0) {
                if (((pPVar13->dir_in == '\x04') || (pPVar13->dir_in != pPVar13->dir_out)) ||
                   ((uVar9 & 4) == 0 && (uVar4 & 0x40) == 0)) goto LAB_002123cc;
                pPVar13->flags = uVar9 & 0xfffffffd;
              }
              if (uVar14 == 0) {
LAB_0021237a:
                uVar8 = *P;
                iVar11 = (int)pPVar13->org_u - *(int *)(uVar8 + 0x30);
LAB_0021239f:
                lVar10 = (long)iVar11 * (long)(int)FVar2;
                pPVar13->cur_u =
                     (long)(int)((ulong)(lVar10 + (lVar10 >> 0x3f) + 0x8000) >> 0x10) +
                     *(long *)(uVar8 + 0x40);
              }
              else {
                uVar8 = 0;
                do {
                  if (pPVar13->org_u < *(long *)(P[uVar8] + 0x30)) {
                    uVar12 = uVar8;
                    if ((int)uVar8 == 0) goto LAB_0021237a;
                    break;
                  }
                  uVar8 = uVar8 + 1;
                  uVar12 = uVar15;
                } while (uVar14 != (uint)uVar8);
                uVar8 = P[(int)uVar12 - 1];
                uVar12 = 0;
                pPVar5 = strongs_0[0xf];
                do {
                  if (uVar15 == uVar12) {
                    uVar9 = 0;
                    goto LAB_0021238c;
                  }
                  ppPVar3 = &pPVar5->prev;
                  uVar12 = uVar12 + 1;
                  pPVar5 = (PSH_Point_conflict)&pPVar5[-1].cur_u;
                } while (pPVar13->org_u <= (*ppPVar3)->org_u);
                uVar9 = (uVar14 + 1) - (int)uVar12;
LAB_0021238c:
                lVar10 = pPVar13->org_u;
                if (uVar9 == uVar14) {
                  uVar8 = P[uVar14 - 1];
                  iVar11 = (int)lVar10 - *(int *)(uVar8 + 0x30);
                  goto LAB_0021239f;
                }
                a_ = lVar10 - *(long *)(uVar8 + 0x30);
                if (a_ == 0) {
                  pPVar13->cur_u = *(FT_Pos *)(uVar8 + 0x40);
                }
                else {
                  uVar12 = P[uVar9];
                  if (lVar10 == *(long *)(uVar12 + 0x30)) {
                    pPVar13->cur_u = *(FT_Pos *)(uVar12 + 0x40);
                  }
                  else {
                    lVar10 = *(long *)(uVar8 + 0x40);
                    FVar6 = FT_MulDiv(a_,*(long *)(uVar12 + 0x40) - lVar10,
                                      *(long *)(uVar12 + 0x30) - *(long *)(uVar8 + 0x30));
                    pPVar13->cur_u = FVar6 + lVar10;
                    uVar4 = pPVar13->flags2;
                  }
                }
              }
              pPVar13->flags2 = uVar4 | 0x20;
            }
LAB_002123cc:
            pPVar13 = pPVar13 + 1;
          } while (pPVar13 < pPVar1);
        }
      }
      if (P != &local_e8) {
        ft_mem_free(memory,P);
      }
    }
  }
  return;
}

Assistant:

static void
  psh_glyph_interpolate_normal_points( PSH_Glyph  glyph,
                                       FT_Int     dimension )
  {

#if 1
    /* first technique: a point is strong if it is a local extremum */

    PSH_Dimension  dim    = &glyph->globals->dimension[dimension];
    FT_Fixed       scale  = dim->scale_mult;
    FT_Memory      memory = glyph->memory;

    PSH_Point*     strongs     = NULL;
    PSH_Point      strongs_0[PSH_MAX_STRONG_INTERNAL];
    FT_UInt        num_strongs = 0;

    PSH_Point      points = glyph->points;
    PSH_Point      points_end = points + glyph->num_points;
    PSH_Point      point;


    /* first count the number of strong points */
    for ( point = points; point < points_end; point++ )
    {
      if ( psh_point_is_strong( point ) )
        num_strongs++;
    }

    if ( num_strongs == 0 )  /* nothing to do here */
      return;

    /* allocate an array to store a list of points, */
    /* stored in increasing org_u order             */
    if ( num_strongs <= PSH_MAX_STRONG_INTERNAL )
      strongs = strongs_0;
    else
    {
      FT_Error  error;


      if ( FT_NEW_ARRAY( strongs, num_strongs ) )
        return;
    }

    num_strongs = 0;
    for ( point = points; point < points_end; point++ )
    {
      PSH_Point*  insert;


      if ( !psh_point_is_strong( point ) )
        continue;

      for ( insert = strongs + num_strongs; insert > strongs; insert-- )
      {
        if ( insert[-1]->org_u <= point->org_u )
          break;

        insert[0] = insert[-1];
      }
      insert[0] = point;
      num_strongs++;
    }

    /* now try to interpolate all normal points */
    for ( point = points; point < points_end; point++ )
    {
      if ( psh_point_is_strong( point ) )
        continue;

      /* sometimes, some local extrema are smooth points */
      if ( psh_point_is_smooth( point ) )
      {
        if ( point->dir_in == PSH_DIR_NONE   ||
             point->dir_in != point->dir_out )
          continue;

        if ( !psh_point_is_extremum( point ) &&
             !psh_point_is_inflex( point )   )
          continue;

        point->flags &= ~PSH_POINT_SMOOTH;
      }

      /* find best enclosing point coordinates then interpolate */
      {
        PSH_Point   before, after;
        FT_UInt     nn;


        for ( nn = 0; nn < num_strongs; nn++ )
          if ( strongs[nn]->org_u > point->org_u )
            break;

        if ( nn == 0 )  /* point before the first strong point */
        {
          after = strongs[0];

          point->cur_u = after->cur_u +
                           FT_MulFix( point->org_u - after->org_u,
                                      scale );
        }
        else
        {
          before = strongs[nn - 1];

          for ( nn = num_strongs; nn > 0; nn-- )
            if ( strongs[nn - 1]->org_u < point->org_u )
              break;

          if ( nn == num_strongs )  /* point is after last strong point */
          {
            before = strongs[nn - 1];

            point->cur_u = before->cur_u +
                             FT_MulFix( point->org_u - before->org_u,
                                        scale );
          }
          else
          {
            FT_Pos  u;


            after = strongs[nn];

            /* now interpolate point between before and after */
            u = point->org_u;

            if ( u == before->org_u )
              point->cur_u = before->cur_u;

            else if ( u == after->org_u )
              point->cur_u = after->cur_u;

            else
              point->cur_u = before->cur_u +
                               FT_MulDiv( u - before->org_u,
                                          after->cur_u - before->cur_u,
                                          after->org_u - before->org_u );
          }
        }
        psh_point_set_fitted( point );
      }
    }

    if ( strongs != strongs_0 )
      FT_FREE( strongs );

#endif /* 1 */

  }